

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<long,_double>::InnerMap::TransferTree
          (InnerMap *this,void **table,size_type index)

{
  Tree *tree;
  _Base_ptr p_Var1;
  iterator local_40;
  
  tree = (Tree *)table[index];
  p_Var1 = (tree->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    InsertUnique(&local_40,this,
                 this->num_buckets_ - 1 & (this->seed_ | 1) * ((*(Node **)(p_Var1 + 1))->kv).k_,
                 *(Node **)(p_Var1 + 1));
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while ((_Rb_tree_header *)p_Var1 != &(tree->_M_t)._M_impl.super__Rb_tree_header);
  DestroyTree(this,tree);
  return;
}

Assistant:

void TransferTree(void* const* table, size_type index) {
      Tree* tree = static_cast<Tree*>(table[index]);
      typename Tree::iterator tree_it = tree->begin();
      do {
        Node* node = NodePtrFromKeyPtr(*tree_it);
        InsertUnique(BucketNumber(**tree_it), node);
      } while (++tree_it != tree->end());
      DestroyTree(tree);
    }